

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_add_many(REF_NODE ref_node,REF_INT n,REF_GLOB *global_orig)

{
  REF_STATUS RVar1;
  int iVar2;
  REF_GLOB *original;
  REF_INT *sorted_index;
  ulong uVar3;
  undefined8 uVar4;
  ulong uVar5;
  char *pcVar6;
  uint uVar7;
  REF_INT local;
  
  if (n < 0) {
    pcVar6 = "malloc global of REF_GLOB negative";
    uVar4 = 0x179;
LAB_00165412:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar4,
           "ref_node_add_many",pcVar6);
    RVar1 = 1;
  }
  else {
    original = (REF_GLOB *)malloc((ulong)(uint)n * 8);
    if (original == (REF_GLOB *)0x0) {
      pcVar6 = "malloc global of REF_GLOB NULL";
      uVar4 = 0x179;
    }
    else {
      uVar7 = 0;
      for (uVar5 = 0; (uint)n != uVar5; uVar5 = uVar5 + 1) {
        RVar1 = ref_node_local(ref_node,global_orig[uVar5],&local);
        if (RVar1 == 5) {
          original[(int)uVar7] = global_orig[uVar5];
          uVar7 = uVar7 + 1;
        }
      }
      if ((int)uVar7 < 0) {
        pcVar6 = "malloc sorted of REF_INT negative";
        uVar4 = 0x186;
        goto LAB_00165412;
      }
      uVar5 = (ulong)uVar7;
      sorted_index = (REF_INT *)malloc(uVar5 * 4);
      if (sorted_index != (REF_INT *)0x0) {
        uVar7 = ref_sort_heap_glob(uVar7,original,sorted_index);
        if (uVar7 == 0) {
          iVar2 = 0;
          for (uVar3 = 1; uVar3 < uVar5; uVar3 = uVar3 + 1) {
            if (original[sorted_index[uVar3]] == original[sorted_index[iVar2]]) {
              original[sorted_index[uVar3]] = -1;
            }
            else {
              iVar2 = (int)uVar3;
            }
          }
          for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
            if ((original[uVar3] != -1) &&
               (uVar7 = ref_node_add_core(ref_node,original[uVar3],&local), uVar7 != 0)) {
              uVar5 = (ulong)uVar7;
              pcVar6 = "add core";
              uVar4 = 0x197;
              goto LAB_0016539c;
            }
          }
          uVar7 = ref_node_rebuild_sorted_global(ref_node);
          if (uVar7 == 0) {
            free(sorted_index);
            free(original);
            return 0;
          }
          uVar5 = (ulong)uVar7;
          pcVar6 = "rebuild globals";
          uVar4 = 0x19a;
        }
        else {
          uVar5 = (ulong)uVar7;
          pcVar6 = "heap";
          uVar4 = 0x188;
        }
LAB_0016539c:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               uVar4,"ref_node_add_many",uVar5,pcVar6);
        return (REF_STATUS)uVar5;
      }
      pcVar6 = "malloc sorted of REF_INT NULL";
      uVar4 = 0x186;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar4,
           "ref_node_add_many",pcVar6);
    RVar1 = 2;
  }
  return RVar1;
}

Assistant:

REF_FCN REF_STATUS ref_node_add_many(REF_NODE ref_node, REF_INT n,
                                     REF_GLOB *global_orig) {
  REF_STATUS status;
  REF_INT i, j, local, nadd;

  REF_GLOB *global;
  REF_INT *sorted;

  /* copy, removing existing nodes from list */

  ref_malloc(global, n, REF_GLOB);

  nadd = 0;
  for (i = 0; i < n; i++) {
    status = ref_node_local(ref_node, global_orig[i], &local);
    if (REF_NOT_FOUND == status) {
      global[nadd] = global_orig[i];
      nadd++;
    }
  }

  /* remove duplicates from list so core add can be used with existing check */

  ref_malloc(sorted, nadd, REF_INT);

  RSS(ref_sort_heap_glob(nadd, global, sorted), "heap");

  j = 0;
  for (i = 1; i < nadd; i++) {
    if (global[sorted[i]] != global[sorted[j]]) {
      j = i;
      continue;
    }
    global[sorted[i]] = REF_EMPTY;
  }

  /* add remaining via core */

  for (i = 0; i < nadd; i++)
    if (REF_EMPTY != global[i]) {
      RSS(ref_node_add_core(ref_node, global[i], &local), "add core");
    }

  RSS(ref_node_rebuild_sorted_global(ref_node), "rebuild globals");

  ref_free(sorted);
  ref_free(global);

  return REF_SUCCESS;
}